

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_120d51::preprocessor<baryonyx::raw_problem>::is_unused_variable
          (preprocessor<baryonyx::raw_problem> *this,int variable)

{
  int iVar1;
  pointer ppVar2;
  int *piVar3;
  pointer piVar4;
  int *piVar5;
  bool bVar6;
  
  ppVar2 = (this->cache).
           super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar5 = *(int **)&ppVar2[variable].in_equal_constraints.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl;
  piVar3 = *(pointer *)
            ((long)&ppVar2[variable].in_equal_constraints.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
  bVar6 = piVar5 == piVar3;
  if (!bVar6) {
    piVar4 = (this->equal_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = piVar4[*piVar5];
    while (iVar1 < 1) {
      piVar5 = piVar5 + 1;
      bVar6 = piVar5 == piVar3;
      if (bVar6) goto LAB_0013c1be;
      iVar1 = piVar4[*piVar5];
    }
    if (!bVar6) {
      return false;
    }
  }
LAB_0013c1be:
  piVar5 = ppVar2[variable].in_greater_constraints.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  piVar3 = *(pointer *)
            ((long)&ppVar2[variable].in_greater_constraints.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
  bVar6 = piVar5 == piVar3;
  if (!bVar6) {
    piVar4 = (this->greater_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = piVar4[*piVar5];
    while (iVar1 < 1) {
      piVar5 = piVar5 + 1;
      bVar6 = piVar5 == piVar3;
      if (bVar6) goto LAB_0013c201;
      iVar1 = piVar4[*piVar5];
    }
    if (!bVar6) {
      return false;
    }
  }
LAB_0013c201:
  piVar5 = ppVar2[variable].in_less_constraints.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  piVar3 = *(pointer *)
            ((long)&ppVar2[variable].in_less_constraints.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
  bVar6 = piVar5 == piVar3;
  if (!bVar6) {
    piVar4 = (this->less_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = piVar4[*piVar5];
    while (iVar1 < 1) {
      piVar5 = piVar5 + 1;
      bVar6 = piVar5 == piVar3;
      if (bVar6) {
        return bVar6;
      }
      iVar1 = piVar4[*piVar5];
    }
  }
  return bVar6;
}

Assistant:

bool is_unused_variable(int variable)
    {
        for (int cst : cache[variable].in_equal_constraints)
            if (equal_constraints[cst] > 0)
                return false;
        for (int cst : cache[variable].in_greater_constraints)
            if (greater_constraints[cst] > 0)
                return false;
        for (int cst : cache[variable].in_less_constraints)
            if (less_constraints[cst] > 0)
                return false;

        return true;
    }